

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDependence
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  ScalarEvolutionAnalysis *this_00;
  Op OVar1;
  pointer pDVar2;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var3;
  pointer ppVar4;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var5;
  bool bVar6;
  int iVar7;
  DistanceEntry *entry;
  Instruction *pIVar8;
  Instruction *pIVar9;
  pointer pDVar10;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var11;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var12;
  SENode *pSVar13;
  SENode *pSVar14;
  Loop *loop;
  DistanceEntry *pDVar15;
  _Base_ptr p_Var16;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range4;
  char *pcVar17;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *__x;
  LoopDependenceAnalysis *this_01;
  Instruction *pIVar18;
  string *psVar19;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript;
  pointer ppVar20;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  current_loops;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  PartitionedSubscripts sets_of_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  local_238;
  _Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
  local_208;
  undefined1 local_1e8 [8];
  _Rb_tree_node_base local_1e0;
  PartitionedSubscripts local_1b8;
  undefined1 local_1a0 [32];
  string local_180;
  string local_160;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  local_140;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  MarkUnsusedDistanceEntriesAsIrrelevant(this,source,destination,distance_vector);
  pIVar8 = GetOperandDefinition(this,source,0);
  pIVar9 = GetOperandDefinition(this,destination,0);
  OVar1 = pIVar8->opcode_;
  if (pIVar9->opcode_ == OpAccessChain || OVar1 == OpAccessChain) {
    if ((OVar1 == OpAccessChain) == (pIVar9->opcode_ == OpAccessChain)) {
      pIVar8 = GetOperandDefinition(this,pIVar8,0);
      pIVar9 = GetOperandDefinition(this,pIVar9,0);
      if ((pIVar8->opcode_ != OpAccessChain) && (pIVar9->opcode_ != OpAccessChain)) {
        if (pIVar8 != pIVar9) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Proved independence through different arrays.",
                     (allocator<char> *)&local_238);
          PrintDebug(this,&local_50);
          std::__cxx11::string::_M_dispose();
          return true;
        }
        GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&local_128,this,source);
        GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&local_140,this,destination);
        PartitionSubscripts(&local_1b8,this,
                            (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             *)&local_128,
                            (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             *)&local_140);
        p_Var11 = &(local_1b8.
                    super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
        p_Var5 = &(local_1b8.
                   super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t;
        while (__x = p_Var5, __x != p_Var11) {
          p_Var12 = p_Var11;
          p_Var5 = __x + 1;
          if ((__x->_M_impl).super__Rb_tree_header._M_node_count != 1) {
            do {
              p_Var11 = p_Var12 + -1;
              if (p_Var11 == __x) goto LAB_0022e3ad;
              p_Var3 = p_Var12 + -1;
              p_Var12 = p_Var11;
            } while ((p_Var3->_M_impl).super__Rb_tree_header._M_node_count != 1);
            std::
            _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            ::swap(__x,p_Var11);
          }
        }
LAB_0022e3ad:
        this_00 = &this->scalar_evolution_;
        for (p_Var11 = &(local_1b8.
                         super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t; p_Var11 < __x;
            p_Var11 = p_Var11 + 1) {
          p_Var16 = (p_Var11->_M_impl).super__Rb_tree_header._M_header._M_left;
          pIVar9 = (Instruction *)p_Var16[1]._M_parent;
          pSVar13 = ScalarEvolutionAnalysis::AnalyzeInstruction
                              (this_00,*(Instruction **)(p_Var16 + 1));
          pSVar13 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar13);
          pSVar14 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,pIVar9);
          pSVar14 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar14);
          local_1e8 = (undefined1  [8])pSVar13;
          local_1e0._0_8_ = pSVar14;
          loop = GetLoopForSubscriptPair
                           (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8
                           );
          if ((loop == (Loop *)0x0) || (bVar6 = IsSupportedLoop(this,loop), bVar6)) {
            iVar7 = (**pSVar13->_vptr_SENode)(pSVar13);
            if ((iVar7 == 6) || (iVar7 = (**pSVar14->_vptr_SENode)(pSVar14), iVar7 == 6)) {
              psVar19 = &local_90;
              pcVar17 = 
              "GetDependence found source_node || destination_node as CanNotCompute. Abandoning evaluation for this subscript."
              ;
              goto LAB_0022e47a;
            }
            bVar6 = IsZIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
            if (bVar6) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_160,"Found a ZIV subscript pair",
                         (allocator<char> *)&local_238);
              PrintDebug(this,&local_160);
              std::__cxx11::string::_M_dispose();
              bVar6 = ZIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                   local_1e8);
              if (!bVar6) goto LAB_0022e513;
              pcVar17 = "Proved independence with ZIVTest.";
              psVar19 = &local_b0;
LAB_0022e7d0:
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)psVar19,pcVar17,(allocator<char> *)&local_238);
              PrintDebug(this,psVar19);
              std::__cxx11::string::_M_dispose();
            }
            else {
LAB_0022e513:
              bVar6 = IsSIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8
                           );
              if (bVar6) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)(local_1a0 + 0x20),"Found a SIV subscript pair.",
                           (allocator<char> *)&local_238);
                PrintDebug(this,(string *)(local_1a0 + 0x20));
                std::__cxx11::string::_M_dispose();
                bVar6 = SIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                     local_1e8,distance_vector);
                if (bVar6) {
                  pcVar17 = "Proved independence with SIVTest.";
                  psVar19 = &local_d0;
                  goto LAB_0022e7d0;
                }
              }
              bVar6 = IsMIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8
                           );
              if (!bVar6) goto LAB_0022e4b2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1a0,"Found a MIV subscript pair.",
                         (allocator<char> *)&local_238);
              PrintDebug(this,(string *)local_1a0);
              this_01 = (LoopDependenceAnalysis *)local_1a0;
              std::__cxx11::string::_M_dispose();
              bVar6 = GCDMIVTest(this_01,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                         local_1e8);
              if (!bVar6) goto LAB_0022e4b2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f0,"Proved independence with the GCD test.",
                         (allocator<char> *)&local_238);
              PrintDebug(this,&local_f0);
              std::__cxx11::string::_M_dispose();
              CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                            *)&local_238,this,pSVar13,pSVar14);
              for (; (_Rb_tree_header *)local_238._M_impl.super__Rb_tree_header._M_header._M_left !=
                     &local_238._M_impl.super__Rb_tree_header;
                  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)
                       std::_Rb_tree_increment
                                 (local_238._M_impl.super__Rb_tree_header._M_header._M_left)) {
                pDVar15 = GetDistanceEntryForLoop
                                    (this,*(Loop **)(local_238._M_impl.super__Rb_tree_header.
                                                     _M_header._M_left + 1),distance_vector);
                pDVar15->direction = NONE;
              }
              std::
              _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
              ::~_Rb_tree((_Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                           *)&local_238);
            }
            goto LAB_0022e7fc;
          }
          psVar19 = &local_70;
          pcVar17 = "GetDependence found an unsupported loop form. Assuming <=> for loop.";
LAB_0022e47a:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar19,pcVar17,(allocator<char> *)&local_238);
          PrintDebug(this,psVar19);
          std::__cxx11::string::_M_dispose();
          pDVar15 = GetDistanceEntryForSubscriptPair
                              (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                    local_1e8,distance_vector);
          if (pDVar15 != (DistanceEntry *)0x0) {
            pDVar15->direction = ALL;
          }
LAB_0022e4b2:
        }
        do {
          if (local_1b8.
              super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish <= __x) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_110,
                       "Couldn\'t prove independence.\nAll possible direction information has been collected in the input DistanceVector."
                       ,(allocator<char> *)&local_238);
            PrintDebug(this,&local_110);
            std::__cxx11::string::_M_dispose();
            bVar6 = false;
            goto LAB_0022e7fe;
          }
          std::
          _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          ::_Rb_tree(&local_238,__x);
          local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (p_Var16 = local_238._M_impl.super__Rb_tree_header._M_header._M_left;
              ppVar4 = local_208._M_impl.super__Vector_impl_data._M_finish,
              ppVar20 = local_208._M_impl.super__Vector_impl_data._M_start,
              (_Rb_tree_header *)p_Var16 != &local_238._M_impl.super__Rb_tree_header;
              p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
            pIVar9 = (Instruction *)p_Var16[1]._M_parent;
            pSVar13 = ScalarEvolutionAnalysis::AnalyzeInstruction
                                (this_00,*(Instruction **)(p_Var16 + 1));
            pSVar13 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar13);
            pSVar14 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,pIVar9);
            local_1e0._0_8_ = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar14);
            local_1e8 = (undefined1  [8])pSVar13;
            std::
            vector<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>>
            ::emplace_back<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>
                      ((vector<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>>
                        *)&local_208,
                       (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
          }
          for (; ppVar20 != ppVar4; ppVar20 = ppVar20 + 1) {
            CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                          *)local_1e8,this,ppVar20->first,ppVar20->second);
            p_Var16 = local_1e0._M_left;
            while ((p_Var16 != &local_1e0 &&
                   (bVar6 = IsSupportedLoop(this,*(Loop **)(p_Var16 + 1)), bVar6))) {
              p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
            }
            std::
            _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
            ::~_Rb_tree((_Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                         *)local_1e8);
          }
          bVar6 = DeltaTest(this,(vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                                  *)&local_208,distance_vector);
          std::
          _Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
          ::~_Vector_base(&local_208);
          std::
          _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          ::~_Rb_tree(&local_238);
          __x = __x + 1;
        } while (!bVar6);
LAB_0022e7fc:
        bVar6 = true;
LAB_0022e7fe:
        std::
        vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
        ::~vector(&local_1b8);
        std::
        _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        ~_Vector_base(&local_140);
        std::
        _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        ~_Vector_base(&local_128);
        return bVar6;
      }
      pDVar2 = (distance_vector->entries).
               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar10 = (distance_vector->entries).
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar2;
          pDVar10 = pDVar10 + 1) {
        pDVar10->dependence_information = UNKNOWN;
        pDVar10->direction = ALL;
        pDVar10->distance = 0;
        pDVar10->peel_first = false;
        pDVar10->peel_last = false;
        *(ulong *)&pDVar10->field_0x12 = (ulong)(uint6)local_238._M_impl._0_6_;
        *(undefined8 *)((long)&pDVar10->point_x + 2) = 0;
        pDVar10->point_y = 0;
      }
    }
    else {
      pIVar18 = pIVar8;
      if (OVar1 == OpAccessChain) {
        pIVar18 = pIVar9;
        pIVar9 = pIVar8;
      }
      pIVar9 = GetOperandDefinition(this,pIVar9,0);
      if (pIVar18 != pIVar9) {
        return true;
      }
      pDVar2 = (distance_vector->entries).
               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar10 = (distance_vector->entries).
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar2;
          pDVar10 = pDVar10 + 1) {
        pDVar10->dependence_information = UNKNOWN;
        pDVar10->direction = ALL;
        pDVar10->distance = 0;
        pDVar10->peel_first = false;
        pDVar10->peel_last = false;
        *(ulong *)&pDVar10->field_0x12 = (ulong)(uint6)local_238._M_impl._0_6_;
        *(undefined8 *)((long)&pDVar10->point_x + 2) = 0;
        pDVar10->point_y = 0;
      }
    }
  }
  else {
    if (pIVar8 != pIVar9) {
      return true;
    }
    pDVar2 = (distance_vector->entries).
             super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar10 = (distance_vector->entries).
                   super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar2;
        pDVar10 = pDVar10 + 1) {
      pDVar10->dependence_information = UNKNOWN;
      pDVar10->direction = ALL;
      pDVar10->distance = 0;
      pDVar10->peel_first = false;
      pDVar10->peel_last = false;
      *(ulong *)&pDVar10->field_0x12 = (ulong)(uint6)local_238._M_impl._0_6_;
      *(undefined8 *)((long)&pDVar10->point_x + 2) = 0;
      pDVar10->point_y = 0;
    }
  }
  return false;
}

Assistant:

bool LoopDependenceAnalysis::GetDependence(const Instruction* source,
                                           const Instruction* destination,
                                           DistanceVector* distance_vector) {
  // Start off by finding and marking all the loops in |loops_| that are
  // irrelevant to the dependence analysis.
  MarkUnsusedDistanceEntriesAsIrrelevant(source, destination, distance_vector);

  Instruction* source_access_chain = GetOperandDefinition(source, 0);
  Instruction* destination_access_chain = GetOperandDefinition(destination, 0);

  auto num_access_chains =
      (source_access_chain->opcode() == spv::Op::OpAccessChain) +
      (destination_access_chain->opcode() == spv::Op::OpAccessChain);

  // If neither is an access chain, then they are load/store to a variable.
  if (num_access_chains == 0) {
    if (source_access_chain != destination_access_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If only one is an access chain, it could be accessing a part of a struct
  if (num_access_chains == 1) {
    auto source_is_chain =
        source_access_chain->opcode() == spv::Op::OpAccessChain;
    auto access_chain =
        source_is_chain ? source_access_chain : destination_access_chain;
    auto variable =
        source_is_chain ? destination_access_chain : source_access_chain;

    auto location_in_chain = GetOperandDefinition(access_chain, 0);

    if (variable != location_in_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If the access chains aren't collecting from the same structure there is no
  // dependence.
  Instruction* source_array = GetOperandDefinition(source_access_chain, 0);
  Instruction* destination_array =
      GetOperandDefinition(destination_access_chain, 0);

  // Nested access chains are not supported yet, bail out.
  if (source_array->opcode() == spv::Op::OpAccessChain ||
      destination_array->opcode() == spv::Op::OpAccessChain) {
    for (auto& entry : distance_vector->GetEntries()) {
      entry = DistanceEntry();
    }
    return false;
  }

  if (source_array != destination_array) {
    PrintDebug("Proved independence through different arrays.");
    return true;
  }

  // To handle multiple subscripts we must get every operand in the access
  // chains past the first.
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  auto sets_of_subscripts =
      PartitionSubscripts(source_subscripts, destination_subscripts);

  auto first_coupled = std::partition(
      std::begin(sets_of_subscripts), std::end(sets_of_subscripts),
      [](const std::set<std::pair<Instruction*, Instruction*>>& set) {
        return set.size() == 1;
      });

  // Go through each subscript testing for independence.
  // If any subscript results in independence, we prove independence between the
  // load and store.
  // If we can't prove independence we store what information we can gather in
  // a DistanceVector.
  for (auto it = std::begin(sets_of_subscripts); it < first_coupled; ++it) {
    auto source_subscript = std::get<0>(*(*it).begin());
    auto destination_subscript = std::get<1>(*(*it).begin());

    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_subscript));
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_subscript));

    // Check the loops are in a form we support.
    auto subscript_pair = std::make_pair(source_node, destination_node);

    const Loop* loop = GetLoopForSubscriptPair(subscript_pair);
    if (loop) {
      if (!IsSupportedLoop(loop)) {
        PrintDebug(
            "GetDependence found an unsupported loop form. Assuming <=> for "
            "loop.");
        DistanceEntry* distance_entry =
            GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
        if (distance_entry) {
          distance_entry->direction = DistanceEntry::Directions::ALL;
        }
        continue;
      }
    }

    // If either node is simplified to a CanNotCompute we can't perform any
    // analysis so must assume <=> dependence and return.
    if (source_node->GetType() == SENode::CanNotCompute ||
        destination_node->GetType() == SENode::CanNotCompute) {
      // Record the <=> dependence if we can get a DistanceEntry
      PrintDebug(
          "GetDependence found source_node || destination_node as "
          "CanNotCompute. Abandoning evaluation for this subscript.");
      DistanceEntry* distance_entry =
          GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
      if (distance_entry) {
        distance_entry->direction = DistanceEntry::Directions::ALL;
      }
      continue;
    }

    // We have no induction variables so can apply a ZIV test.
    if (IsZIV(subscript_pair)) {
      PrintDebug("Found a ZIV subscript pair");
      if (ZIVTest(subscript_pair)) {
        PrintDebug("Proved independence with ZIVTest.");
        return true;
      }
    }

    // We have only one induction variable so should attempt an SIV test.
    if (IsSIV(subscript_pair)) {
      PrintDebug("Found a SIV subscript pair.");
      if (SIVTest(subscript_pair, distance_vector)) {
        PrintDebug("Proved independence with SIVTest.");
        return true;
      }
    }

    // We have multiple induction variables so should attempt an MIV test.
    if (IsMIV(subscript_pair)) {
      PrintDebug("Found a MIV subscript pair.");
      if (GCDMIVTest(subscript_pair)) {
        PrintDebug("Proved independence with the GCD test.");
        auto current_loops = CollectLoops(source_node, destination_node);

        for (auto current_loop : current_loops) {
          auto distance_entry =
              GetDistanceEntryForLoop(current_loop, distance_vector);
          distance_entry->direction = DistanceEntry::Directions::NONE;
        }
        return true;
      }
    }
  }

  for (auto it = first_coupled; it < std::end(sets_of_subscripts); ++it) {
    auto coupled_instructions = *it;
    std::vector<SubscriptPair> coupled_subscripts{};

    for (const auto& elem : coupled_instructions) {
      auto source_subscript = std::get<0>(elem);
      auto destination_subscript = std::get<1>(elem);

      SENode* source_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(source_subscript));
      SENode* destination_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(destination_subscript));

      coupled_subscripts.push_back({source_node, destination_node});
    }

    auto supported = true;

    for (const auto& subscript : coupled_subscripts) {
      auto loops = CollectLoops(std::get<0>(subscript), std::get<1>(subscript));

      auto is_subscript_supported =
          std::all_of(std::begin(loops), std::end(loops),
                      [this](const Loop* l) { return IsSupportedLoop(l); });

      supported = supported && is_subscript_supported;
    }

    if (DeltaTest(coupled_subscripts, distance_vector)) {
      return true;
    }
  }

  // We were unable to prove independence so must gather all of the direction
  // information we found.
  PrintDebug(
      "Couldn't prove independence.\n"
      "All possible direction information has been collected in the input "
      "DistanceVector.");

  return false;
}